

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlCatalogErr(xmlCatalogEntryPtr catal,xmlNodePtr node,int error,char *msg,xmlChar *str1,
                  xmlChar *str2,xmlChar *str3)

{
  int iVar1;
  int res;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  int error_local;
  xmlNodePtr node_local;
  xmlCatalogEntryPtr catal_local;
  
  iVar1 = xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,catal,node,
                        0x14,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,
                        (char *)str3,0,0,msg,str1,str2,str3);
  if (iVar1 < 0) {
    xmlCatalogErrMemory();
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlCatalogErr(xmlCatalogEntryPtr catal, xmlNodePtr node, int error,
               const char *msg, const xmlChar *str1, const xmlChar *str2,
	       const xmlChar *str3)
{
    int res;

    res = xmlRaiseError(NULL, NULL, NULL, catal, node,
                        XML_FROM_CATALOG, error, XML_ERR_ERROR, NULL, 0,
                        (const char *) str1, (const char *) str2,
                        (const char *) str3, 0, 0,
                        msg, str1, str2, str3);
    if (res < 0)
        xmlCatalogErrMemory();
}

static void
xmlCatalogPrintDebug(const char *fmt, ...) {
    va_list ap;

    va_start(ap, fmt);
    xmlVPrintErrorMessage(fmt, ap);
    va_end(ap);
}